

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

void Nova::Log::Log_Class::Pop_Scope(void)

{
  char cVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  
  if (::(anonymous_namespace)::private_instance == 0) {
    Initialize_Logging(false,false,0x40000000,false);
  }
  lVar3 = ::(anonymous_namespace)::private_instance;
  if (*(char *)(::(anonymous_namespace)::private_instance + 0xe) == '\0') {
    lVar4 = (**(code **)(**(long **)(::(anonymous_namespace)::private_instance + 0x28) + 0x30))
                      (*(long **)(::(anonymous_namespace)::private_instance + 0x28),
                       ::(anonymous_namespace)::private_instance);
    *(long *)(lVar3 + 0x28) = lVar4;
    poVar2 = (anonymous_namespace)::cerr;
    if (lVar4 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((anonymous_namespace)::cerr,"Could not pop scope. Defaulting to root",0x27);
      cVar1 = (char)poVar2;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      *(undefined8 *)(lVar3 + 0x28) = *(undefined8 *)(lVar3 + 0x20);
    }
  }
  return;
}

Assistant:

Log_Class* Nova::Log::Instance()
{
    if(private_instance==nullptr) Initialize_Logging();
    return private_instance;
}